

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bool fmt::v7::detail::dragonbox::is_center_integer<double>
               (carrier_uint two_f,int exponent,int minus_k)

{
  int iVar1;
  bool bVar2;
  
  if (exponent < 0x57) {
    if (exponent < 10) {
      bVar2 = true;
      if (exponent < -4) {
        if (minus_k - exponent < 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                      ,0x6e2,"");
        }
        if (two_f == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                      ,0x6e3,"");
        }
        iVar1 = 0;
        for (; (two_f & 1) == 0; two_f = two_f >> 1 | 0x8000000000000000) {
          iVar1 = iVar1 + 1;
        }
        bVar2 = minus_k - exponent < iVar1;
      }
    }
    else {
      if (0x17 < minus_k) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x6f2,"too large exponent");
      }
      bVar2 = two_f * *(long *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10)
              < *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10 + 8)
              || two_f * *(long *)(basic_data<void>::divtest_table_for_pow5_64 +
                                  (long)minus_k * 0x10) -
                 *(ulong *)(basic_data<void>::divtest_table_for_pow5_64 + (long)minus_k * 0x10 + 8)
                 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_center_integer(typename float_info<T>::carrier_uint two_f, int exponent,
                       int minus_k) FMT_NOEXCEPT {
  // Exponent for 5 is negative.
  if (exponent > float_info<T>::divisibility_check_by_5_threshold) return false;
  if (exponent > float_info<T>::case_fc_upper_threshold)
    return divisible_by_power_of_5(two_f, minus_k);
  // Both exponents are nonnegative.
  if (exponent >= float_info<T>::case_fc_lower_threshold) return true;
  // Exponent for 2 is negative.
  return divisible_by_power_of_2(two_f, minus_k - exponent + 1);
}